

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O1

void __thiscall CScheduler::CScheduler(CScheduler *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->newTaskMutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->newTaskMutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->newTaskMutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->newTaskMutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_service_thread)._M_id._M_thread = 0;
  (this->newTaskMutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  std::condition_variable::condition_variable(&this->newTaskScheduled);
  p_Var1 = &(this->taskQueue)._M_t._M_impl.super__Rb_tree_header;
  (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    *(undefined8 *)((long)&(this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count + 6) =
         0;
    (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

CScheduler::CScheduler() = default;